

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  uint uVar1;
  bool bVar2;
  string *psVar3;
  NodeBase *pNVar4;
  iterator *piVar5;
  TableEntryPtr *pTVar6;
  undefined8 uVar7;
  uint uVar8;
  NodeBase *item;
  undefined8 uVar9;
  UntypedMapBase *this_00;
  char *pcVar10;
  iterator tree_it;
  uint uStack_74;
  TreeIterator TStack_70;
  LogMessageFatal aLStack_60 [16];
  iterator *piStack_50;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *pMStack_48;
  undefined1 local_38 [24];
  
  this_00 = (UntypedMapBase *)local_38;
  local_38._0_8_ = pos.super_UntypedMapIterator.node_;
  local_38._8_8_ = pos.super_UntypedMapIterator.m_;
  local_38._16_8_ = pos.super_UntypedMapIterator._16_8_;
  pNVar4 = (pos.super_UntypedMapIterator.node_)->next;
  if ((pos.super_UntypedMapIterator.node_)->next == (NodeBase *)0x0) {
    internal::UntypedMapIterator::SearchFrom
              ((UntypedMapIterator *)local_38,pos.super_UntypedMapIterator.bucket_index_ + 1);
    pNVar4 = (NodeBase *)local_38._0_8_;
  }
  local_38._0_8_ = pNVar4;
  *(undefined8 *)&(__return_storage_ptr__->super_UntypedMapIterator).bucket_index_ = local_38._16_8_
  ;
  (__return_storage_ptr__->super_UntypedMapIterator).node_ = (NodeBase *)local_38._0_8_;
  (__return_storage_ptr__->super_UntypedMapIterator).m_ = (UntypedMapBase *)local_38._8_8_;
  if (pos.super_UntypedMapIterator.m_ == (UntypedMapBase *)this) {
    psVar3 = (string *)0x0;
  }
  else {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (pos.super_UntypedMapIterator.m_,this,"pos.m_ == static_cast<Base*>(this)");
  }
  if (psVar3 == (string *)0x0) {
    internal::KeyMapBase<google::protobuf::MapKey>::erase_no_destroy
              (&this->super_KeyMapBase<google::protobuf::MapKey>,
               pos.super_UntypedMapIterator.bucket_index_,
               (KeyNode *)pos.super_UntypedMapIterator.node_);
    DestroyNode(this,(Node *)pos.super_UntypedMapIterator.node_);
    return __return_storage_ptr__;
  }
  Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::erase();
  uStack_74 = (uint)psVar3;
  TStack_70.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
        *)0x0;
  TStack_70.position_ = -1;
  piStack_50 = __return_storage_ptr__;
  pMStack_48 = this;
  bVar2 = internal::KeyMapBase<google::protobuf::MapKey>::revalidate_if_necessary
                    ((KeyMapBase<google::protobuf::MapKey> *)this_00,&uStack_74,(KeyNode *)item,
                     &TStack_70);
  if (bVar2) {
    pNVar4 = (NodeBase *)this_00->table_[uStack_74];
    if ((pNVar4 == (NodeBase *)0x0) || (((ulong)pNVar4 & 1) != 0)) {
      pcVar10 = "TableEntryIsNonEmptyList(b)";
      uVar7 = 0x1b;
      uVar9 = 0x3bc;
    }
    else {
      pNVar4 = internal::EraseFromLinkedList(item,pNVar4);
      if (((ulong)pNVar4 & 1) == 0) {
        this_00->table_[uStack_74] = (TableEntryPtr)pNVar4;
        goto LAB_002ef840;
      }
      pcVar10 = "(reinterpret_cast<uintptr_t>(node) & 1) == 0";
      uVar7 = 0x2c;
      uVar9 = 0x1ac;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_60,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map.h"
               ,uVar9,uVar7,pcVar10);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_60);
  }
  tree_it.position_ = TStack_70.position_;
  tree_it.node_ = TStack_70.node_;
  tree_it._12_4_ = 0;
  internal::UntypedMapBase::EraseFromTree(this_00,uStack_74,tree_it);
LAB_002ef840:
  this_00->num_elements_ = this_00->num_elements_ - 1;
  piVar5 = (iterator *)(ulong)uStack_74;
  if (uStack_74 == this_00->index_of_first_non_null_) {
    uVar1 = this_00->num_buckets_;
    piVar5 = (iterator *)(ulong)uVar1;
    uVar8 = this_00->index_of_first_non_null_;
    if (uVar8 < uVar1) {
      piVar5 = (iterator *)(ulong)-uVar1;
      pTVar6 = this_00->table_ + uVar8;
      do {
        uVar8 = uVar8 + 1;
        if (*pTVar6 != 0) {
          return piVar5;
        }
        this_00->index_of_first_non_null_ = uVar8;
        pTVar6 = pTVar6 + 1;
      } while (uVar8 != uVar1);
    }
  }
  return piVar5;
}

Assistant:

iterator erase(iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto next = std::next(pos);
    ABSL_DCHECK_EQ(pos.m_, static_cast<Base*>(this));
    auto* node = static_cast<Node*>(pos.node_);
    this->erase_no_destroy(pos.bucket_index_, node);
    DestroyNode(node);
    return next;
  }